

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O3

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)2> *this,string_view filepath,
          openmode open_flags,executor_type *executor)

{
  basic_executor_type<std::allocator<void>,_0UL> local_38;
  
  local_38.target_ = executor->target_;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(&this->executor_wrapper_,&local_38);
  std::fstream::fstream(&this->frw_seq_file_);
  (this->file_path_)._M_dataplus._M_p = (pointer)&(this->file_path_).field_2;
  (this->file_path_)._M_string_length = 0;
  (this->file_path_).field_2._M_local_buf[0] = '\0';
  this->eof_ = false;
  open(this,(char *)filepath._M_len,(int)filepath._M_str,(ulong)(uint)open_flags);
  return;
}

Assistant:

basic_seq_coro_file(std::string_view filepath,
                      std::ios::ios_base::openmode open_flags,
                      asio::io_context::executor_type executor)
      : executor_wrapper_(executor) {
    open(filepath, open_flags);
  }